

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTest.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  bool bVar1;
  DOMDocument *doc;
  DOMDocumentType *pDVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  XercesDOMParser *this;
  XMLCh *pXVar6;
  bool bVar7;
  DOMNode *local_90;
  XercesDOMParser *parser;
  DOMElement *eleTest;
  DOMAttr *attr;
  DOMElement *elt;
  DOMEntity *docEntity;
  DOMDocumentType *docDocType;
  DOMDocument *d;
  char *pMessage;
  XMLException *toCatch;
  DOMTest local_1a;
  byte local_19;
  DOMTest test;
  char **ppcStack_18;
  bool OK;
  char **param_1_local;
  int param_0_local;
  
  local_19 = 1;
  ppcStack_18 = param_2;
  DOMTest::DOMTest(&local_1a);
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  doc = DOMTest::createDocument(&local_1a);
  xercesc_4_0::XMLString::transcode
            ("testDocument1",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  pDVar2 = DOMTest::createDocumentType(&local_1a,doc,tempStr);
  (**(code **)(*(long *)(doc + 0x18) + 0x88))(doc + 0x18,pDVar2);
  xercesc_4_0::XMLString::transcode
            ("ourEntityNode",tempStr,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  DOMTest::createEntity(&local_1a,doc,tempStr);
  xercesc_4_0::XMLString::transcode
            ("d",tempStr3,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  bVar1 = DOMTest::docBuilder(&local_1a,doc,tempStr3);
  local_19 = (local_19 & 1 & bVar1) != 0;
  local_90 = (DOMNode *)0x0;
  if (doc != (DOMDocument *)0x0) {
    local_90 = (DOMNode *)(doc + 0x18);
  }
  DOMTest::findTestNodes(&local_1a,local_90);
  bVar1 = DOMTest::testAttr(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testCDATASection(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testCharacterData(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testChildNodeList(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testComment(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDeepNodeList(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDocument(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDocumentFragment(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDocumentType(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDOMImplementation(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testElement(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testEntityReference(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testNode(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testNotation(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testPI(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testText(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testDOMerrors(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testXPath(&local_1a,doc);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testRegex(&local_1a);
  local_19 = (local_19 & 1 & bVar1) != 0;
  DOMTest::testElementNode = (DOMElement *)0x0;
  DOMTest::testAttributeNode = (DOMAttr *)0x0;
  DOMTest::testTextNode = (DOMText *)0x0;
  DOMTest::testCDATASectionNode = (DOMCDATASection *)0x0;
  DOMTest::testEntityReferenceNode = (DOMEntityReference *)0x0;
  DOMTest::testEntityNode = (DOMEntity *)0x0;
  DOMTest::testProcessingInstructionNode = (DOMProcessingInstruction *)0x0;
  DOMTest::testCommentNode = (DOMComment *)0x0;
  DOMTest::testDocumentNode = (DOMDocument *)0x0;
  DOMTest::testDocumentTypeNode = (DOMDocumentType *)0x0;
  DOMTest::testDocumentFragmentNode = (DOMDocumentFragment *)0x0;
  DOMTest::testNotationNode = (DOMNotation *)0x0;
  plVar3 = (long *)(**(code **)(*(long *)doc + 0x18))(doc,tempStr3);
  (**(code **)(*plVar3 + 0x160))(plVar3,tempStr3);
  (**(code **)(*plVar3 + 0x138))();
  plVar3 = (long *)(**(code **)(*(long *)doc + 0x18))(doc,tempStr3);
  plVar4 = (long *)(**(code **)(*(long *)doc + 0x48))(doc,tempStr3);
  (**(code **)(*plVar4 + 0x158))(plVar4,tempStr3);
  (**(code **)(*plVar3 + 0x168))(plVar3,plVar4);
  (**(code **)(*plVar3 + 0x1d0))(plVar3,plVar4,1);
  lVar5 = (**(code **)(*(long *)doc + 0x98))(doc,tempStr3);
  if (lVar5 == 0) {
    fprintf(_stderr,"getElementById test failed at line %i\n",0x3a7);
    local_19 = 0;
  }
  (**(code **)(*plVar3 + 0x138))();
  lVar5 = (**(code **)(*(long *)doc + 0x98))(doc,tempStr3);
  if (lVar5 != 0) {
    fprintf(_stderr,"getElementById test failed at line %i\n",0x3b0);
    local_19 = 0;
  }
  pXVar6 = tempStr;
  (**(code **)(*(long *)(doc + 0x18) + 0xe8))(doc + 0x18,tempStr,tempStr,&userhandler);
  (**(code **)(*(long *)(doc + 0x18) + 0x138))(doc + 0x18);
  this = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pXVar6);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this);
  bVar7 = SUB81(this,0);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar7);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar7);
  xercesc_4_0::AbstractDOMParser::setCreateEntityReferenceNodes((AbstractDOMParser *)this,true);
  bVar1 = DOMTest::testBaseURI(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  xercesc_4_0::AbstractDOMParser::setCreateEntityReferenceNodes((AbstractDOMParser *)this,false);
  bVar1 = DOMTest::testBaseURI(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar7);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar7);
  bVar1 = DOMTest::testBaseURI(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  xercesc_4_0::AbstractDOMParser::setCreateEntityReferenceNodes((AbstractDOMParser *)this,true);
  bVar1 = DOMTest::testBaseURI(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testWholeText(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testScanner(&local_1a,this);
  local_19 = (local_19 & 1 & bVar1) != 0;
  if (this != (XercesDOMParser *)0x0) {
    (**(code **)(*(long *)this + 8))();
  }
  bVar1 = DOMTest::testLSExceptions(&local_1a);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testElementTraversal(&local_1a);
  local_19 = (local_19 & 1 & bVar1) != 0;
  bVar1 = DOMTest::testUtilFunctions(&local_1a);
  local_19 = (local_19 & 1 & bVar1) != 0;
  xercesc_4_0::XMLPlatformUtils::Terminate();
  if ((local_19 & 1) == 0) {
    printf("Test Failed\n");
    param_1_local._4_4_ = 4;
  }
  else {
    printf("Test Run Successfully\n");
    param_1_local._4_4_ = 0;
  }
  return param_1_local._4_4_;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
 {
     bool OK = true;

     {
         //  Nest entire test in an inner block.
         //     Reference counting should recover all document
         //     storage when this block exits.

         DOMTest test;
         try {
             XMLPlatformUtils::Initialize();
         }
         catch (const XMLException& toCatch) {
             char *pMessage = XMLString::transcode(toCatch.getMessage());
             fprintf(stderr, "Error during initialization! \n  %s \n", pMessage);
             XMLString::release(&pMessage);
             return -1;
         }

         // for (int i=0; i< 1000; i++)
         // {
         // AH Revisit  //  startTime = System.currentTimeMillis();
         //     if(!OK)
         //     break;

         DOMDocument* d = test.createDocument();

         XMLString::transcode("testDocument1", tempStr, 3999);
         DOMDocumentType* docDocType = test.createDocumentType(d,tempStr);
         d->appendChild(docDocType);

         XMLString::transcode("ourEntityNode", tempStr, 3999);
         DOMEntity* docEntity = test.createEntity( d, tempStr);
         UNUSED(docEntity); // silence warning
         //Build a branch for entityReference tests
         // DOMText* entityChildText = d.createTextNode("entityChildText information"); //
         // docEntity->appendChild(entityChildText);
         // docDocType->getEntities()->setNamedItem(docEntity);

         XMLString::transcode("d", tempStr3, 3999);
         OK &= test.docBuilder(d, tempStr3);

         test.findTestNodes((DOMNode*)d);

         OK &= test.testAttr(d);
         OK &= test.testCDATASection(d);
         OK &= test.testCharacterData(d);
         OK &= test.testChildNodeList(d);
         OK &= test.testComment(d);
         OK &= test.testDeepNodeList(d);
         OK &= test.testDocument(d);
         OK &= test.testDocumentFragment(d);
         OK &= test.testDocumentType(d);
         OK &= test.testDOMImplementation(d);
         OK &= test.testElement(d);
//         OK &= test.testEntity(d);  // Can not test entities;  only parser can create them.
         OK &= test.testEntityReference(d);
         OK &= test.testNode(d);
         OK &= test.testNotation(d);
         OK &= test.testPI(d);
         OK &= test.testText(d);
         OK &= test.testDOMerrors(d);
         OK &= test.testXPath(d);
         OK &= test.testRegex();

         // Null out the static object references in class DOMTest,
         // which will recover their storage.
         DOMTest::testElementNode = 0;
         DOMTest::testAttributeNode = 0;
         DOMTest::testTextNode = 0;
         DOMTest::testCDATASectionNode = 0;
         DOMTest::testEntityReferenceNode = 0;
         DOMTest::testEntityNode = 0;
         DOMTest::testProcessingInstructionNode = 0;
         DOMTest::testCommentNode = 0;
         DOMTest::testDocumentNode = 0;
         DOMTest::testDocumentTypeNode = 0;
         DOMTest::testDocumentFragmentNode = 0;
         DOMTest::testNotationNode = 0;

        // test release of attributes
        DOMElement* elt = d->createElement(tempStr3);
        elt->setAttribute(tempStr3, tempStr3);
        elt->release();
        
        elt = d->createElement(tempStr3);
        DOMAttr *attr = d->createAttribute(tempStr3);
        attr->setValue(tempStr3);
        elt->setAttributeNode(attr);
        elt->setIdAttributeNode(attr, true);

        DOMElement *eleTest = d->getElementById(tempStr3);
        if(eleTest==NULL)
        {
            fprintf(stderr, "getElementById test failed at line %i\n", __LINE__);
            OK = false;
        }

        //all good until here
        elt->release();
        eleTest = d->getElementById(tempStr3);
        if(eleTest!=NULL)
        {
            fprintf(stderr, "getElementById test failed at line %i\n", __LINE__);
            OK = false;
        }

        // we couldn't really test the user data handler call as the userhandler is already
        // deleted when the release() is done, but still set it to test the code internally
        d->setUserData(tempStr, (void*) tempStr, &userhandler);
        d->release();

        // Test baseURI. BaseURI is set on nodes at parse time so we
        // cannot use the docBuilder document above

        //Setup parser

        XercesDOMParser *parser = new XercesDOMParser;
        parser->setValidationScheme(XercesDOMParser::Val_Never);
        parser->setDoNamespaces(true);
        parser->setDoSchema(true);
        parser->setCreateEntityReferenceNodes(true);

        OK &= test.testBaseURI(parser);

        parser->setCreateEntityReferenceNodes(false);
        OK &= test.testBaseURI(parser);

        parser->setDoNamespaces(false);
        parser->setDoSchema(false);
        OK &= test.testBaseURI(parser);

        parser->setCreateEntityReferenceNodes(true);
        OK &= test.testBaseURI(parser);

		OK &= test.testWholeText(parser);
        OK &= test.testScanner(parser);
        delete parser;

        OK &= test.testLSExceptions();

        OK &= test.testElementTraversal();

        OK &= test.testUtilFunctions();
    }

    XMLPlatformUtils::Terminate();

    if (!OK) {
        printf("Test Failed\n");
        return 4;
    }

    printf("Test Run Successfully\n");

    return 0;
}